

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::ConvertQuadsToTriangles(ON_Mesh *this)

{
  int iVar1;
  int iVar2;
  undefined1 local_25;
  uint split_method;
  double angle_tolerance_radians;
  double planar_tolerance;
  ON_Mesh *this_local;
  
  ConvertNonPlanarQuadsToTriangles(this,-1.23432101234321e+308,-1.23432101234321e+308,1);
  iVar1 = QuadCount(this);
  local_25 = false;
  if (iVar1 == 0) {
    iVar1 = TriangleCount(this);
    iVar2 = FaceCount(this);
    local_25 = iVar1 == iVar2;
  }
  return (bool)(-local_25 & 1);
}

Assistant:

bool ON_Mesh::ConvertQuadsToTriangles()
{
  double planar_tolerance = ON_UNSET_VALUE;
  double angle_tolerance_radians = ON_UNSET_VALUE;
  unsigned int split_method = 1;

  ConvertNonPlanarQuadsToTriangles(
    planar_tolerance, 
    angle_tolerance_radians,
    split_method
  );

  return ( QuadCount() == 0 && TriangleCount() == FaceCount() ) ? true : false;
}